

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
__thiscall ninx::parser::element::Block::make_text_block(Block *this,Block *parent,string *text)

{
  TextElement *this_00;
  Block *this_01;
  pointer *__ptr;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  block_statements;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  local_58;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  local_38;
  
  this_00 = (TextElement *)operator_new(0x38);
  TextElement::TextElement(this_00,text);
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>
  ::
  emplace_back<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>
              *)&local_58,
             (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
              *)&local_38);
  if ((TextElement *)
      local_38.
      super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (TextElement *)0x0) {
    (*(((Statement *)
       &(local_38.
         super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t)->super_ASTElement)._vptr_ASTElement[1])()
    ;
  }
  this_01 = (Block *)operator_new(0xf8);
  local_38.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Block(this_01,&local_38);
  (this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement = (_func_int **)this_01
  ;
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector(&local_38);
  (*(this_01->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[4])
            (this_01,parent);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ninx::parser::element::Block>
ninx::parser::element::Block::make_text_block(Block *parent, const std::string &text) {
    auto element{std::make_unique<TextElement>(text)};
    std::vector<std::unique_ptr<Statement>> block_statements;
    block_statements.push_back(std::move(element));

    auto block{std::make_unique<Block>(std::move(block_statements))};
    block->set_parent(parent);

    return block;
}